

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_nanoftp(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int test_ret_3;
  undefined8 *puVar18;
  int n_ctx;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  undefined4 uVar22;
  undefined8 uVar23;
  int test_ret_6;
  ulong uVar24;
  int test_ret_4;
  undefined **ppuVar25;
  ulong uVar26;
  int test_ret_5;
  int test_ret_7;
  undefined4 *puVar27;
  int test_ret_2;
  int test_ret_1;
  int test_ret;
  int test_ret_8;
  uint local_48;
  int local_44;
  int local_3c;
  undefined **local_38;
  
  if (quiet == '\0') {
    puts("Testing nanoftp : 14 of 22 functions ...");
  }
  ppuVar25 = &PTR_anon_var_dwarf_66f_00165d00;
  uVar19 = 0;
  local_3c = 0;
  do {
    iVar3 = xmlMemBlocks();
    if (uVar19 < 3) {
      lVar15 = xmlNanoFTPNewCtxt(*ppuVar25);
    }
    else {
      lVar15 = 0;
    }
    xmlNanoFTPCheckResponse(lVar15);
    call_tests = call_tests + 1;
    if (lVar15 != 0) {
      xmlNanoFTPFreeCtxt(lVar15);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNanoFTPCheckResponse",(ulong)(uint)(iVar4 - iVar3));
      local_3c = local_3c + 1;
      printf(" %d",(ulong)uVar19);
      putchar(10);
    }
    uVar19 = uVar19 + 1;
    ppuVar25 = ppuVar25 + 1;
  } while (uVar19 != 4);
  function_tests = function_tests + 1;
  iVar3 = xmlMemBlocks();
  xmlNanoFTPCleanup();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar3 != iVar4) {
    iVar5 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNanoFTPCleanup",(ulong)(uint)(iVar5 - iVar3));
    putchar(10);
  }
  function_tests = function_tests + 1;
  ppuVar25 = &PTR_anon_var_dwarf_66f_00165d00;
  uVar19 = 0;
  local_44 = 0;
  do {
    iVar5 = xmlMemBlocks();
    if (uVar19 < 3) {
      lVar15 = xmlNanoFTPNewCtxt(*ppuVar25);
    }
    else {
      lVar15 = 0;
    }
    xmlNanoFTPCloseConnection(lVar15);
    call_tests = call_tests + 1;
    if (lVar15 != 0) {
      xmlNanoFTPFreeCtxt(lVar15);
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNanoFTPCloseConnection",(ulong)(uint)(iVar6 - iVar5));
      local_44 = local_44 + 1;
      printf(" %d",(ulong)uVar19);
      putchar(10);
    }
    uVar19 = uVar19 + 1;
    ppuVar25 = ppuVar25 + 1;
  } while (uVar19 != 4);
  function_tests = function_tests + 1;
  local_38 = &PTR_anon_var_dwarf_66f_00165d00;
  local_48 = 0;
  uVar19 = 0;
  do {
    puVar18 = &DAT_00165d58;
    uVar20 = 0;
    do {
      iVar5 = xmlMemBlocks();
      if (uVar19 < 3) {
        lVar15 = xmlNanoFTPNewCtxt((&PTR_anon_var_dwarf_66f_00165d00)[uVar19]);
      }
      else {
        lVar15 = 0;
      }
      if (uVar20 < 3) {
        uVar23 = *puVar18;
      }
      else {
        uVar23 = 0;
      }
      xmlNanoFTPCwd(lVar15,uVar23);
      call_tests = call_tests + 1;
      if (lVar15 != 0) {
        xmlNanoFTPFreeCtxt(lVar15);
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNanoFTPCwd",(ulong)(uint)(iVar6 - iVar5));
        local_48 = local_48 + 1;
        printf(" %d",(ulong)uVar19);
        printf(" %d");
        putchar(10);
      }
      uVar20 = uVar20 + 1;
      puVar18 = puVar18 + 1;
    } while (uVar20 != 4);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 4);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar19 = 0;
  do {
    puVar18 = &DAT_00165d90;
    uVar20 = 0;
    do {
      iVar6 = xmlMemBlocks();
      if (uVar19 < 3) {
        lVar15 = xmlNanoFTPNewCtxt((&PTR_anon_var_dwarf_66f_00165d00)[uVar19]);
      }
      else {
        lVar15 = 0;
      }
      if (uVar20 < 7) {
        uVar23 = *puVar18;
      }
      else {
        uVar23 = 0;
      }
      xmlNanoFTPDele(lVar15,uVar23);
      call_tests = call_tests + 1;
      if (lVar15 != 0) {
        xmlNanoFTPFreeCtxt(lVar15);
      }
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNanoFTPDele",(ulong)(uint)(iVar7 - iVar6));
        iVar5 = iVar5 + 1;
        printf(" %d",(ulong)uVar19);
        printf(" %d");
        putchar(10);
      }
      uVar20 = uVar20 + 1;
      puVar18 = puVar18 + 1;
    } while (uVar20 != 8);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 4);
  function_tests = function_tests + 1;
  uVar19 = 0;
  iVar6 = 0;
  do {
    iVar7 = xmlMemBlocks();
    if (uVar19 < 3) {
      lVar15 = xmlNanoFTPNewCtxt(*local_38);
    }
    else {
      lVar15 = 0;
    }
    xmlNanoFTPGetResponse(lVar15);
    call_tests = call_tests + 1;
    if (lVar15 != 0) {
      xmlNanoFTPFreeCtxt(lVar15);
    }
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNanoFTPGetResponse",(ulong)(uint)(iVar8 - iVar7));
      iVar6 = iVar6 + 1;
      printf(" %d",(ulong)uVar19);
      putchar(10);
    }
    uVar19 = uVar19 + 1;
    local_38 = local_38 + 1;
  } while (uVar19 != 4);
  iVar7 = (uint)(iVar3 != iVar4) + local_3c + local_44 + local_48;
  function_tests = function_tests + 1;
  iVar3 = xmlMemBlocks();
  xmlNanoFTPInit();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar3 != iVar4) {
    iVar8 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNanoFTPInit",(ulong)(uint)(iVar8 - iVar3));
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar18 = &DAT_00165d90;
  uVar19 = 0;
  iVar8 = 0;
  do {
    iVar9 = xmlMemBlocks();
    if (uVar19 < 7) {
      uVar23 = *puVar18;
    }
    else {
      uVar23 = 0;
    }
    xmlNanoFTPNewCtxt(uVar23);
    xmlNanoFTPClose();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNanoFTPNewCtxt",(ulong)(uint)(iVar10 - iVar9));
      iVar8 = iVar8 + 1;
      printf(" %d",(ulong)uVar19);
      putchar(10);
    }
    uVar19 = uVar19 + 1;
    puVar18 = puVar18 + 1;
  } while (uVar19 != 8);
  function_tests = function_tests + 1;
  puVar18 = &DAT_00165d90;
  uVar21 = 0;
  iVar9 = 0;
  do {
    iVar10 = xmlMemBlocks();
    if ((uint)uVar21 < 7) {
      uVar23 = *puVar18;
    }
    else {
      uVar23 = 0;
    }
    xmlNanoFTPOpen(uVar23);
    xmlNanoFTPClose();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar10 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNanoFTPOpen",(ulong)(uint)(iVar11 - iVar10));
      iVar9 = iVar9 + 1;
      printf(" %d",uVar21);
      putchar(10);
    }
    uVar19 = (uint)uVar21 + 1;
    uVar21 = (ulong)uVar19;
    puVar18 = puVar18 + 1;
  } while (uVar19 != 8);
  function_tests = function_tests + 1;
  uVar19 = 0;
  do {
    uVar21 = 0;
    do {
      uVar24 = 0;
      do {
        uVar26 = 0;
        do {
          lVar15 = 0;
          do {
            if (uVar19 < 3) {
              uVar23 = (&DAT_00165d58)[uVar19];
            }
            else {
              uVar23 = 0;
            }
            uVar22 = 0xffffffff;
            if ((uint)uVar21 < 4) {
              uVar22 = (&DAT_0016343c)[uVar21];
            }
            if ((uint)uVar24 < 3) {
              uVar17 = (&DAT_00165d58)[uVar24];
            }
            else {
              uVar17 = 0;
            }
            if ((uint)uVar26 < 3) {
              uVar16 = (&DAT_00165d58)[uVar26];
            }
            else {
              uVar16 = 0;
            }
            xmlNanoFTPProxy(uVar23,uVar22,uVar17,uVar16,
                            *(undefined4 *)((long)&DAT_0016343c + lVar15));
            call_tests = call_tests + 1;
            xmlResetLastError();
            lVar15 = lVar15 + 4;
          } while ((int)lVar15 != 0x10);
          uVar20 = (uint)uVar26 + 1;
          uVar26 = (ulong)uVar20;
        } while (uVar20 != 4);
        uVar20 = (uint)uVar24 + 1;
        uVar24 = (ulong)uVar20;
      } while (uVar20 != 4);
      uVar20 = (uint)uVar21 + 1;
      uVar21 = (ulong)uVar20;
    } while (uVar20 != 4);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 4);
  function_tests = function_tests + 1;
  ppuVar25 = &PTR_anon_var_dwarf_66f_00165d00;
  uVar19 = 0;
  iVar10 = 0;
  do {
    iVar11 = xmlMemBlocks();
    if (uVar19 < 3) {
      lVar15 = xmlNanoFTPNewCtxt(*ppuVar25);
    }
    else {
      lVar15 = 0;
    }
    xmlNanoFTPQuit(lVar15);
    call_tests = call_tests + 1;
    if (lVar15 != 0) {
      xmlNanoFTPFreeCtxt(lVar15);
    }
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar11 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNanoFTPQuit",(ulong)(uint)(iVar12 - iVar11));
      iVar10 = iVar10 + 1;
      printf(" %d",(ulong)uVar19);
      putchar(10);
    }
    uVar19 = uVar19 + 1;
    ppuVar25 = ppuVar25 + 1;
  } while (uVar19 != 4);
  function_tests = function_tests + 1;
  iVar11 = 0;
  uVar19 = 0;
  do {
    local_48 = 0;
    bVar1 = true;
    do {
      bVar2 = bVar1;
      iVar12 = 0;
      puVar27 = &DAT_0016343c;
      do {
        iVar13 = xmlMemBlocks();
        if (uVar19 < 3) {
          lVar15 = xmlNanoFTPNewCtxt((&PTR_anon_var_dwarf_66f_00165d00)[uVar19]);
        }
        else {
          lVar15 = 0;
        }
        xmlNanoFTPRead(lVar15,0,*puVar27);
        call_tests = call_tests + 1;
        if (lVar15 != 0) {
          xmlNanoFTPFreeCtxt(lVar15);
        }
        xmlResetLastError();
        iVar14 = xmlMemBlocks();
        if (iVar13 != iVar14) {
          iVar14 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNanoFTPRead",(ulong)(uint)(iVar14 - iVar13));
          iVar11 = iVar11 + 1;
          printf(" %d",(ulong)uVar19);
          printf(" %d",(ulong)local_48);
          printf(" %d");
          putchar(10);
        }
        iVar12 = iVar12 + 1;
        puVar27 = puVar27 + 1;
      } while (iVar12 != 4);
      local_48 = 1;
      bVar1 = false;
    } while (bVar2);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 4);
  function_tests = function_tests + 1;
  uVar19 = 0;
  puVar18 = &DAT_00165d90;
  do {
    if (uVar19 < 7) {
      uVar23 = *puVar18;
    }
    else {
      uVar23 = 0;
    }
    xmlNanoFTPScanProxy(uVar23);
    call_tests = call_tests + 1;
    xmlResetLastError();
    uVar19 = uVar19 + 1;
    puVar18 = puVar18 + 1;
  } while (uVar19 != 8);
  function_tests = function_tests + 1;
  iVar12 = 0;
  uVar19 = 0;
  do {
    puVar18 = &DAT_00165d90;
    uVar20 = 0;
    do {
      iVar13 = xmlMemBlocks();
      if (uVar19 < 3) {
        lVar15 = xmlNanoFTPNewCtxt((&PTR_anon_var_dwarf_66f_00165d00)[uVar19]);
      }
      else {
        lVar15 = 0;
      }
      if (uVar20 < 7) {
        uVar23 = *puVar18;
      }
      else {
        uVar23 = 0;
      }
      xmlNanoFTPUpdateURL(lVar15,uVar23);
      call_tests = call_tests + 1;
      if (lVar15 != 0) {
        xmlNanoFTPFreeCtxt(lVar15);
      }
      xmlResetLastError();
      iVar14 = xmlMemBlocks();
      if (iVar13 != iVar14) {
        iVar14 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNanoFTPUpdateURL",(ulong)(uint)(iVar14 - iVar13));
        iVar12 = iVar12 + 1;
        printf(" %d",(ulong)uVar19);
        printf(" %d");
        putchar(10);
      }
      uVar20 = uVar20 + 1;
      puVar18 = puVar18 + 1;
    } while (uVar20 != 8);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 4);
  function_tests = function_tests + 1;
  uVar19 = iVar8 + iVar9 + iVar7 + iVar5 + iVar6 + (uint)(iVar3 != iVar4) + iVar10 + iVar11 + iVar12
  ;
  if (uVar19 != 0) {
    printf("Module nanoftp: %d errors\n",(ulong)uVar19);
  }
  return uVar19;
}

Assistant:

static int
test_nanoftp(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing nanoftp : 14 of 22 functions ...\n");
    test_ret += test_xmlNanoFTPCheckResponse();
    test_ret += test_xmlNanoFTPCleanup();
    test_ret += test_xmlNanoFTPCloseConnection();
    test_ret += test_xmlNanoFTPCwd();
    test_ret += test_xmlNanoFTPDele();
    test_ret += test_xmlNanoFTPGet();
    test_ret += test_xmlNanoFTPGetConnection();
    test_ret += test_xmlNanoFTPGetResponse();
    test_ret += test_xmlNanoFTPGetSocket();
    test_ret += test_xmlNanoFTPInit();
    test_ret += test_xmlNanoFTPList();
    test_ret += test_xmlNanoFTPNewCtxt();
    test_ret += test_xmlNanoFTPOpen();
    test_ret += test_xmlNanoFTPProxy();
    test_ret += test_xmlNanoFTPQuit();
    test_ret += test_xmlNanoFTPRead();
    test_ret += test_xmlNanoFTPScanProxy();
    test_ret += test_xmlNanoFTPUpdateURL();

    if (test_ret != 0)
	printf("Module nanoftp: %d errors\n", test_ret);
    return(test_ret);
}